

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O3

void RGBAToYJRow_SSSE3(uint8_t *src_rgba,uint8_t *dst_y,int width)

{
  bool bVar1;
  uvec16 auVar2;
  uvec8 auVar3;
  int iVar4;
  undefined1 auVar5 [16];
  ushort uVar6;
  ushort uVar7;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  undefined1 auVar8 [16];
  ushort uVar21;
  ushort uVar22;
  undefined1 auVar23 [16];
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  char cVar33;
  char cVar34;
  char cVar35;
  char cVar36;
  char cVar37;
  char cVar38;
  char cVar39;
  ushort uVar40;
  ushort uVar41;
  ushort uVar44;
  ushort uVar45;
  ushort uVar46;
  ushort uVar47;
  ushort uVar48;
  ushort uVar49;
  ushort uVar50;
  ushort uVar51;
  ushort uVar52;
  ushort uVar53;
  ushort uVar54;
  ushort uVar55;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  ushort uVar56;
  ushort uVar57;
  
  auVar3 = libyuv::kRGBAToYJ;
  auVar2 = libyuv::kSub128;
  do {
    cVar24 = (char)auVar2[0];
    auVar5[0] = *src_rgba - cVar24;
    cVar25 = auVar2[0]._1_1_;
    auVar5[1] = src_rgba[1] - cVar25;
    cVar26 = (char)auVar2[1];
    auVar5[2] = src_rgba[2] - cVar26;
    cVar27 = auVar2[1]._1_1_;
    auVar5[3] = src_rgba[3] - cVar27;
    cVar28 = (char)auVar2[2];
    auVar5[4] = src_rgba[4] - cVar28;
    cVar29 = auVar2[2]._1_1_;
    auVar5[5] = src_rgba[5] - cVar29;
    cVar30 = (char)auVar2[3];
    auVar5[6] = src_rgba[6] - cVar30;
    cVar31 = auVar2[3]._1_1_;
    auVar5[7] = src_rgba[7] - cVar31;
    cVar32 = (char)auVar2[4];
    auVar5[8] = src_rgba[8] - cVar32;
    cVar33 = auVar2[4]._1_1_;
    auVar5[9] = src_rgba[9] - cVar33;
    cVar34 = (char)auVar2[5];
    auVar5[10] = src_rgba[10] - cVar34;
    cVar35 = auVar2[5]._1_1_;
    auVar5[0xb] = src_rgba[0xb] - cVar35;
    cVar36 = (char)auVar2[6];
    auVar5[0xc] = src_rgba[0xc] - cVar36;
    cVar37 = auVar2[6]._1_1_;
    auVar5[0xd] = src_rgba[0xd] - cVar37;
    cVar38 = (char)auVar2[7];
    auVar5[0xe] = src_rgba[0xe] - cVar38;
    cVar39 = auVar2[7]._1_1_;
    auVar5[0xf] = src_rgba[0xf] - cVar39;
    auVar8[0] = src_rgba[0x10] - cVar24;
    auVar8[1] = src_rgba[0x11] - cVar25;
    auVar8[2] = src_rgba[0x12] - cVar26;
    auVar8[3] = src_rgba[0x13] - cVar27;
    auVar8[4] = src_rgba[0x14] - cVar28;
    auVar8[5] = src_rgba[0x15] - cVar29;
    auVar8[6] = src_rgba[0x16] - cVar30;
    auVar8[7] = src_rgba[0x17] - cVar31;
    auVar8[8] = src_rgba[0x18] - cVar32;
    auVar8[9] = src_rgba[0x19] - cVar33;
    auVar8[10] = src_rgba[0x1a] - cVar34;
    auVar8[0xb] = src_rgba[0x1b] - cVar35;
    auVar8[0xc] = src_rgba[0x1c] - cVar36;
    auVar8[0xd] = src_rgba[0x1d] - cVar37;
    auVar8[0xe] = src_rgba[0x1e] - cVar38;
    auVar8[0xf] = src_rgba[0x1f] - cVar39;
    auVar23[0] = src_rgba[0x20] - cVar24;
    auVar23[1] = src_rgba[0x21] - cVar25;
    auVar23[2] = src_rgba[0x22] - cVar26;
    auVar23[3] = src_rgba[0x23] - cVar27;
    auVar23[4] = src_rgba[0x24] - cVar28;
    auVar23[5] = src_rgba[0x25] - cVar29;
    auVar23[6] = src_rgba[0x26] - cVar30;
    auVar23[7] = src_rgba[0x27] - cVar31;
    auVar23[8] = src_rgba[0x28] - cVar32;
    auVar23[9] = src_rgba[0x29] - cVar33;
    auVar23[10] = src_rgba[0x2a] - cVar34;
    auVar23[0xb] = src_rgba[0x2b] - cVar35;
    auVar23[0xc] = src_rgba[0x2c] - cVar36;
    auVar23[0xd] = src_rgba[0x2d] - cVar37;
    auVar23[0xe] = src_rgba[0x2e] - cVar38;
    auVar23[0xf] = src_rgba[0x2f] - cVar39;
    auVar43[0] = src_rgba[0x30] - cVar24;
    auVar43[1] = src_rgba[0x31] - cVar25;
    auVar43[2] = src_rgba[0x32] - cVar26;
    auVar43[3] = src_rgba[0x33] - cVar27;
    auVar43[4] = src_rgba[0x34] - cVar28;
    auVar43[5] = src_rgba[0x35] - cVar29;
    auVar43[6] = src_rgba[0x36] - cVar30;
    auVar43[7] = src_rgba[0x37] - cVar31;
    auVar43[8] = src_rgba[0x38] - cVar32;
    auVar43[9] = src_rgba[0x39] - cVar33;
    auVar43[10] = src_rgba[0x3a] - cVar34;
    auVar43[0xb] = src_rgba[0x3b] - cVar35;
    auVar43[0xc] = src_rgba[0x3c] - cVar36;
    auVar43[0xd] = src_rgba[0x3d] - cVar37;
    auVar43[0xe] = src_rgba[0x3e] - cVar38;
    auVar43[0xf] = src_rgba[0x3f] - cVar39;
    auVar42 = pmaddubsw((undefined1  [16])auVar3,auVar5);
    auVar5 = pmaddubsw((undefined1  [16])auVar3,auVar8);
    auVar8 = pmaddubsw((undefined1  [16])auVar3,auVar23);
    auVar23 = pmaddubsw((undefined1  [16])auVar3,auVar43);
    src_rgba = src_rgba + 0x40;
    auVar43 = phaddw(auVar42,auVar5);
    auVar5 = phaddw(auVar8,auVar23);
    uVar40 = auVar43._0_2_ + auVar2[0];
    uVar44 = auVar43._2_2_ + auVar2[1];
    uVar46 = auVar43._4_2_ + auVar2[2];
    uVar48 = auVar43._6_2_ + auVar2[3];
    uVar50 = auVar43._8_2_ + auVar2[4];
    uVar52 = auVar43._10_2_ + auVar2[5];
    uVar54 = auVar43._12_2_ + auVar2[6];
    uVar56 = auVar43._14_2_ + auVar2[7];
    uVar6 = auVar5._0_2_ + auVar2[0];
    uVar9 = auVar5._2_2_ + auVar2[1];
    uVar11 = auVar5._4_2_ + auVar2[2];
    uVar13 = auVar5._6_2_ + auVar2[3];
    uVar15 = auVar5._8_2_ + auVar2[4];
    uVar17 = auVar5._10_2_ + auVar2[5];
    uVar19 = auVar5._12_2_ + auVar2[6];
    uVar21 = auVar5._14_2_ + auVar2[7];
    uVar41 = uVar40 >> 8;
    uVar45 = uVar44 >> 8;
    uVar47 = uVar46 >> 8;
    uVar49 = uVar48 >> 8;
    uVar51 = uVar50 >> 8;
    uVar53 = uVar52 >> 8;
    uVar55 = uVar54 >> 8;
    uVar57 = uVar56 >> 8;
    uVar7 = uVar6 >> 8;
    uVar10 = uVar9 >> 8;
    uVar12 = uVar11 >> 8;
    uVar14 = uVar13 >> 8;
    uVar16 = uVar15 >> 8;
    uVar18 = uVar17 >> 8;
    uVar20 = uVar19 >> 8;
    uVar22 = uVar21 >> 8;
    *dst_y = (uVar41 != 0) * (uVar41 < 0x100) * (char)(uVar40 >> 8) - (0xff < uVar41);
    dst_y[1] = (uVar45 != 0) * (uVar45 < 0x100) * (char)(uVar44 >> 8) - (0xff < uVar45);
    dst_y[2] = (uVar47 != 0) * (uVar47 < 0x100) * (char)(uVar46 >> 8) - (0xff < uVar47);
    dst_y[3] = (uVar49 != 0) * (uVar49 < 0x100) * (char)(uVar48 >> 8) - (0xff < uVar49);
    dst_y[4] = (uVar51 != 0) * (uVar51 < 0x100) * (char)(uVar50 >> 8) - (0xff < uVar51);
    dst_y[5] = (uVar53 != 0) * (uVar53 < 0x100) * (char)(uVar52 >> 8) - (0xff < uVar53);
    dst_y[6] = (uVar55 != 0) * (uVar55 < 0x100) * (char)(uVar54 >> 8) - (0xff < uVar55);
    dst_y[7] = (uVar57 != 0) * (uVar57 < 0x100) * (char)(uVar56 >> 8) - (0xff < uVar57);
    dst_y[8] = (uVar7 != 0) * (uVar7 < 0x100) * (char)(uVar6 >> 8) - (0xff < uVar7);
    dst_y[9] = (uVar10 != 0) * (uVar10 < 0x100) * (char)(uVar9 >> 8) - (0xff < uVar10);
    dst_y[10] = (uVar12 != 0) * (uVar12 < 0x100) * (char)(uVar11 >> 8) - (0xff < uVar12);
    dst_y[0xb] = (uVar14 != 0) * (uVar14 < 0x100) * (char)(uVar13 >> 8) - (0xff < uVar14);
    dst_y[0xc] = (uVar16 != 0) * (uVar16 < 0x100) * (char)(uVar15 >> 8) - (0xff < uVar16);
    dst_y[0xd] = (uVar18 != 0) * (uVar18 < 0x100) * (char)(uVar17 >> 8) - (0xff < uVar18);
    dst_y[0xe] = (uVar20 != 0) * (uVar20 < 0x100) * (char)(uVar19 >> 8) - (0xff < uVar20);
    dst_y[0xf] = (uVar22 != 0) * (uVar22 < 0x100) * (char)(uVar21 >> 8) - (0xff < uVar22);
    dst_y = dst_y + 0x10;
    iVar4 = width + -0x10;
    bVar1 = 0xf < width;
    width = iVar4;
  } while (iVar4 != 0 && bVar1);
  return;
}

Assistant:

void RGBAToYJRow_SSSE3(const uint8_t* src_rgba, uint8_t* dst_y, int width) {
  asm volatile(
      "movdqa      %3,%%xmm4                     \n"
      "movdqa      %4,%%xmm5                     \n"

      LABELALIGN RGBTOY(xmm5)
      : "+r"(src_rgba),  // %0
        "+r"(dst_y),     // %1
        "+r"(width)      // %2
      : "m"(kRGBAToYJ),  // %3
        "m"(kSub128)     // %4
      : "memory", "cc", "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5", "xmm6");
}